

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlCatalogPtr xmlLoadACatalog(char *filename)

{
  bool bVar1;
  int iVar2;
  xmlCatalogPtr value;
  xmlCatalogEntryPtr pxVar3;
  xmlCatalogPtr pxStack_30;
  int ret;
  xmlCatalogPtr catal;
  xmlChar *first;
  xmlChar *content;
  char *filename_local;
  
  value = (xmlCatalogPtr)xmlLoadFileContent(filename);
  catal = value;
  if (value == (xmlCatalogPtr)0x0) {
    return (xmlCatalogPtr)0x0;
  }
  while( true ) {
    bVar1 = false;
    if ((((char)catal->type != 0) && (bVar1 = false, (char)catal->type != 0x2d)) &&
       (bVar1 = false, (char)catal->type != 0x3c)) {
      if ((((byte)(char)catal->type < 0x41) || (bVar1 = true, 0x5a < (byte)(char)catal->type)) &&
         (bVar1 = false, 0x60 < (byte)(char)catal->type)) {
        bVar1 = (byte)(char)catal->type < 0x7b;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (!bVar1) break;
    catal = (xmlCatalogPtr)((long)&catal->type + 1);
  }
  if ((char)catal->type == 0x3c) {
    pxStack_30 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    if (pxStack_30 == (xmlCatalogPtr)0x0) {
      (*xmlFree)(value);
      return (xmlCatalogPtr)0x0;
    }
    pxVar3 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)filename,
                                xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
    pxStack_30->xml = pxVar3;
  }
  else {
    pxStack_30 = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    if (pxStack_30 == (xmlCatalogPtr)0x0) {
      (*xmlFree)(value);
      return (xmlCatalogPtr)0x0;
    }
    iVar2 = xmlParseSGMLCatalog(pxStack_30,(xmlChar *)value,filename,0);
    if (iVar2 < 0) {
      xmlFreeCatalog(pxStack_30);
      (*xmlFree)(value);
      return (xmlCatalogPtr)0x0;
    }
  }
  (*xmlFree)(value);
  return pxStack_30;
}

Assistant:

xmlCatalogPtr
xmlLoadACatalog(const char *filename)
{
    xmlChar *content;
    xmlChar *first;
    xmlCatalogPtr catal;
    int ret;

    content = xmlLoadFileContent(filename);
    if (content == NULL)
        return(NULL);


    first = content;

    while ((*first != 0) && (*first != '-') && (*first != '<') &&
	   (!(((*first >= 'A') && (*first <= 'Z')) ||
	      ((*first >= 'a') && (*first <= 'z')))))
	first++;

    if (*first != '<') {
	catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
	if (catal == NULL) {
	    xmlFree(content);
	    return(NULL);
	}
        ret = xmlParseSGMLCatalog(catal, content, filename, 0);
	if (ret < 0) {
	    xmlFreeCatalog(catal);
	    xmlFree(content);
	    return(NULL);
	}
    } else {
	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
	if (catal == NULL) {
	    xmlFree(content);
	    return(NULL);
	}
        catal->xml = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
		       NULL, BAD_CAST filename, xmlCatalogDefaultPrefer, NULL);
    }
    xmlFree(content);
    return (catal);
}